

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedArrayStrideTypeAggregateSubCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               string *namePrefix,ProgramInterface interface,DataType type,int expandLevel)

{
  Variable *this;
  ResourceTestCase *this_00;
  Node *ptr;
  ArrayElement *this_01;
  SharedPtr variable;
  SharedPtr structMember;
  SharedPtr arrayElement;
  
  this = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this,parentStructure,type);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)this);
  this_00 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&structMember,interface,4);
  ResourceTestCase::ResourceTestCase
            (this_00,context,&variable,(ProgramResourceQueryTestTarget *)&structMember,
             (namePrefix->_M_dataplus)._M_p);
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_00);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  if (0 < expandLevel) {
    ptr = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)ptr,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&structMember,ptr);
    this_01 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(this_01,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&arrayElement,(Node *)this_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variable,
                   namePrefix,"_struct");
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (context,&structMember,targetGroup,(string *)&variable,interface,type,0);
    std::__cxx11::string::~string((string *)&variable);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&variable,
                   namePrefix,"_array");
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (context,&arrayElement,targetGroup,(string *)&variable,interface,type,0);
    std::__cxx11::string::~string((string *)&variable);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&arrayElement);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr(&structMember);
  }
  return;
}

Assistant:

static void generateBufferBackedArrayStrideTypeAggregateSubCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const std::string& namePrefix, ProgramInterface interface, glu::DataType type, int expandLevel)
{
	// case
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, type));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_ARRAY_STRIDE), namePrefix.c_str()));
	}

	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));

		// _struct
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, structMember, targetGroup, namePrefix + "_struct", interface, type, expandLevel - 1);

		// _array
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, arrayElement, targetGroup, namePrefix + "_array", interface, type, expandLevel - 1);
	}
}